

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

void Rml::StringUtilities::ExpandString(StringList *string_list,String *string,char delimiter)

{
  byte *pbVar1;
  difference_type dVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  uint uVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  char *start_ptr;
  byte local_59;
  byte *local_58;
  String local_50;
  
  __first._M_current = (string->_M_dataplus)._M_p;
  local_58 = (byte *)0x0;
  local_59 = delimiter;
  dVar2 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(__first._M_current + string->_M_string_length),
                     (_Iter_equals_val<const_char>)&local_59);
  if (dVar2 == 0) {
    StripWhitespace(&local_50,string);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
               &local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)string_list,
              dVar2 + ((long)(string_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(string_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    bVar5 = true;
    pbVar3 = (byte *)0x0;
    _Var9._M_current = __first._M_current;
    bVar6 = 0;
    for (; bVar7 = *__first._M_current, bVar7 != 0; __first._M_current = __first._M_current + 1) {
      uVar8 = (uint)bVar7;
      if (((!bVar5) || (bVar6 != 0)) || ((uVar8 != 0x22 && (uVar8 != 0x27)))) {
        if (bVar7 == bVar6) {
          if (((byte *)__first._M_current)[-1] == 0x5c) {
LAB_002c435a:
            if (((0x20 < bVar7) || ((0x100002600U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) ||
               (bVar6 != 0)) {
              pbVar4 = (byte *)__first._M_current;
              pbVar1 = (byte *)__first._M_current;
              if (pbVar3 != (byte *)0x0) {
                pbVar4 = pbVar3;
                pbVar1 = local_58;
              }
              local_58 = pbVar1;
              bVar5 = false;
              pbVar3 = pbVar4;
              _Var9._M_current = __first._M_current;
              bVar7 = bVar6;
              goto LAB_002c43b5;
            }
          }
        }
        else {
          if (local_59 != bVar7 || bVar6 != 0) goto LAB_002c435a;
          if (pbVar3 == (byte *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)string_list);
          }
          else {
            local_50._M_dataplus._M_p = (pointer)((byte *)_Var9._M_current + 1);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&,char_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       string_list,(char **)&local_58,(char **)&local_50);
          }
          local_58 = (byte *)0x0;
          bVar5 = true;
          pbVar3 = (byte *)0x0;
        }
        bVar7 = 0;
      }
LAB_002c43b5:
      bVar6 = bVar7;
    }
    if (pbVar3 != (byte *)0x0) {
      local_50._M_dataplus._M_p = (pointer)((byte *)_Var9._M_current + 1);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
                 (char **)&local_58,(char **)&local_50);
    }
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter)
{
	char quote = 0;
	bool last_char_delimiter = true;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	size_t num_delimiter_values = std::count(string.begin(), string.end(), delimiter);
	if (num_delimiter_values == 0)
	{
		string_list.push_back(StripWhitespace(string));
		return;
	}
	string_list.reserve(string_list.size() + num_delimiter_values + 1);

	while (*ptr)
	{
		// Switch into quote mode if the last char was a delimeter ( excluding whitespace )
		// and we're not already in quote mode
		if (last_char_delimiter && !quote && (*ptr == '"' || *ptr == '\''))
		{
			quote = *ptr;
		}
		// Switch out of quote mode if we encounter a quote that hasn't been escaped
		else if (*ptr == quote && *(ptr - 1) != '\\')
		{
			quote = 0;
		}
		// If we encounter a delimiter while not in quote mode, add the item to the list
		else if (*ptr == delimiter && !quote)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else
				string_list.emplace_back();
			last_char_delimiter = true;
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
			last_char_delimiter = false;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}